

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O2

bool __thiscall chaiscript::parser::ChaiScript_Parser::For_Guards(ChaiScript_Parser *this)

{
  bool bVar1;
  eval_error *peVar2;
  allocator local_41;
  string local_40;
  File_Position local_20;
  
  bVar1 = Equation(this);
  if (bVar1) {
    bVar1 = Eol(this);
    if (!bVar1) goto LAB_0019ce4f;
  }
  else {
LAB_0019ce4f:
    bVar1 = Eol(this);
    if (!bVar1) {
      peVar2 = (eval_error *)__cxa_allocate_exception(0x90);
      std::__cxx11::string::string
                ((string *)&local_40,"\'for\' loop initial statment missing",&local_41);
      local_20.line = (this->m_position).line;
      local_20.column = (this->m_position).col;
      exception::eval_error::eval_error
                (peVar2,&local_40,&local_20,
                 (this->m_filename).
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      __cxa_throw(peVar2,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    make_shared<chaiscript::AST_Node,chaiscript::eval::Noop_AST_Node>();
    std::
    vector<std::shared_ptr<chaiscript::AST_Node>,std::allocator<std::shared_ptr<chaiscript::AST_Node>>>
    ::emplace_back<std::shared_ptr<chaiscript::AST_Node>>
              ((vector<std::shared_ptr<chaiscript::AST_Node>,std::allocator<std::shared_ptr<chaiscript::AST_Node>>>
                *)&this->m_match_stack,(shared_ptr<chaiscript::AST_Node> *)&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_40._M_string_length);
  }
  bVar1 = Equation(this);
  if (bVar1) {
    bVar1 = Eol(this);
    if (bVar1) goto LAB_0019ced3;
  }
  bVar1 = Eol(this);
  if (!bVar1) {
    peVar2 = (eval_error *)__cxa_allocate_exception(0x90);
    std::__cxx11::string::string((string *)&local_40,"\'for\' loop condition missing",&local_41);
    local_20.line = (this->m_position).line;
    local_20.column = (this->m_position).col;
    exception::eval_error::eval_error
              (peVar2,&local_40,&local_20,
               (this->m_filename).
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
    __cxa_throw(peVar2,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
  }
  make_shared<chaiscript::AST_Node,chaiscript::eval::Noop_AST_Node>();
  std::
  vector<std::shared_ptr<chaiscript::AST_Node>,std::allocator<std::shared_ptr<chaiscript::AST_Node>>>
  ::emplace_back<std::shared_ptr<chaiscript::AST_Node>>
            ((vector<std::shared_ptr<chaiscript::AST_Node>,std::allocator<std::shared_ptr<chaiscript::AST_Node>>>
              *)&this->m_match_stack,(shared_ptr<chaiscript::AST_Node> *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_40._M_string_length);
LAB_0019ced3:
  bVar1 = Equation(this);
  if (!bVar1) {
    make_shared<chaiscript::AST_Node,chaiscript::eval::Noop_AST_Node>();
    std::
    vector<std::shared_ptr<chaiscript::AST_Node>,std::allocator<std::shared_ptr<chaiscript::AST_Node>>>
    ::emplace_back<std::shared_ptr<chaiscript::AST_Node>>
              ((vector<std::shared_ptr<chaiscript::AST_Node>,std::allocator<std::shared_ptr<chaiscript::AST_Node>>>
                *)&this->m_match_stack,(shared_ptr<chaiscript::AST_Node> *)&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_40._M_string_length);
  }
  return true;
}

Assistant:

bool For_Guards() {
        if (!(Equation() && Eol()))
        {
          if (!Eol())
          {
            throw exception::eval_error("'for' loop initial statment missing", File_Position(m_position.line, m_position.col), *m_filename);
          } else {
            m_match_stack.push_back(chaiscript::make_shared<AST_Node, eval::Noop_AST_Node>());
          }
        }

        if (!(Equation() && Eol()))
        {
          if (!Eol())
          {
            throw exception::eval_error("'for' loop condition missing", File_Position(m_position.line, m_position.col), *m_filename);
          } else {
            m_match_stack.push_back(chaiscript::make_shared<AST_Node, eval::Noop_AST_Node>());
          }
        }

        if (!Equation())
        {
          m_match_stack.push_back(chaiscript::make_shared<AST_Node, eval::Noop_AST_Node>());
        }

        return true; 
      }